

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::clearFilters(Context *this)

{
  bool bVar1;
  iterator __lhs;
  long *in_RDI;
  vector<doctest::String,_std::allocator<doctest::String>_> *curr;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  *__range1;
  reference in_stack_ffffffffffffffd8;
  __normal_iterator<std::vector<doctest::String,_std::allocator<doctest::String>_>_*,_std::vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>_>
  local_18;
  long local_10;
  
  local_10 = *in_RDI + 0x10c0;
  local_18._M_current =
       (vector<doctest::String,_std::allocator<doctest::String>_> *)
       std::
       vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
       ::begin((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)in_stack_ffffffffffffffd8);
  __lhs = std::
          vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
          ::end((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                 *)in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<doctest::String,_std::allocator<doctest::String>_>_*,_std::vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<std::vector<doctest::String,_std::allocator<doctest::String>_>_*,_std::vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<std::vector<doctest::String,_std::allocator<doctest::String>_>_*,_std::vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>_>
         ::operator*(&local_18);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)0x211316);
    __gnu_cxx::
    __normal_iterator<std::vector<doctest::String,_std::allocator<doctest::String>_>_*,_std::vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(auto& curr : p->filters)
        curr.clear();
}